

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qundogroup.cpp
# Opt level: O3

void QUndoGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_20;
  void *local_18;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == activeStackChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == indexChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == cleanChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == canUndoChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == canRedoChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar1 == undoTextChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar1 == redoTextChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 6;
    }
    goto switchD_0060734c_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0060734c_default;
  switch(_id) {
  case 0:
    local_20 = *_a[1];
    local_10 = &local_20;
    iVar3 = 0;
    break;
  case 1:
    local_10 = &local_20;
    local_20 = CONCAT44(local_20._4_4_,*_a[1]);
    iVar3 = 1;
    break;
  case 2:
    local_10 = &local_20;
    local_20 = CONCAT71(local_20._1_7_,*_a[1]);
    iVar3 = 2;
    break;
  case 3:
    local_10 = &local_20;
    local_20 = CONCAT71(local_20._1_7_,*_a[1]);
    iVar3 = 3;
    break;
  case 4:
    local_10 = &local_20;
    local_20 = CONCAT71(local_20._1_7_,*_a[1]);
    iVar3 = 4;
    break;
  case 5:
    local_10 = (undefined8 *)_a[1];
    iVar3 = 5;
    break;
  case 6:
    local_10 = (undefined8 *)_a[1];
    iVar3 = 6;
    break;
  case 7:
    if (*(QUndoStack **)(*(long *)(_o + 8) + 0x78) != (QUndoStack *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QUndoStack::undo(*(QUndoStack **)(*(long *)(_o + 8) + 0x78));
        return;
      }
      goto LAB_006075d6;
    }
    goto switchD_0060734c_default;
  case 8:
    if (*(QUndoStack **)(*(long *)(_o + 8) + 0x78) != (QUndoStack *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QUndoStack::redo(*(QUndoStack **)(*(long *)(_o + 8) + 0x78));
        return;
      }
      goto LAB_006075d6;
    }
    goto switchD_0060734c_default;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      setActiveStack((QUndoGroup *)_o,*_a[1]);
      return;
    }
    goto LAB_006075d6;
  default:
    goto switchD_0060734c_default;
  }
  local_18 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_18);
switchD_0060734c_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_006075d6:
  __stack_chk_fail();
}

Assistant:

void QUndoGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUndoGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activeStackChanged((*reinterpret_cast< std::add_pointer_t<QUndoStack*>>(_a[1]))); break;
        case 1: _t->indexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->cleanChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->canUndoChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->canRedoChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->undoTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 6: _t->redoTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->undo(); break;
        case 8: _t->redo(); break;
        case 9: _t->setActiveStack((*reinterpret_cast< std::add_pointer_t<QUndoStack*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(QUndoStack * )>(_a, &QUndoGroup::activeStackChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(int )>(_a, &QUndoGroup::indexChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::cleanChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::canUndoChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::canRedoChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(const QString & )>(_a, &QUndoGroup::undoTextChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(const QString & )>(_a, &QUndoGroup::redoTextChanged, 6))
            return;
    }
}